

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O3

void __thiscall
FIX::SocketMonitor::block(SocketMonitor *this,Strategy *strategy,bool should_poll,double timeout)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  _func_int *p_Var3;
  long lVar4;
  _Elt_pointer piVar5;
  _Rb_tree_node_base *p_Var6;
  clock_t cVar7;
  _func_int **pp_Var8;
  _Map_pointer ppiVar9;
  int iVar10;
  undefined7 in_register_00000011;
  uint *puVar11;
  _Map_pointer ppiVar12;
  _Elt_pointer piVar13;
  Strategy *strategy_00;
  _Elt_pointer piVar14;
  ulong uVar15;
  pollfd *__fds;
  uint pfds_size;
  double dVar16;
  undefined8 uStack_70;
  pollfd pStack_68;
  undefined1 *local_60;
  size_t local_58;
  ulong local_50;
  Strategy *local_48;
  undefined4 local_3c;
  double local_38;
  
  ppiVar9 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppiVar12 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar5 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  piVar14 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first;
  puVar11 = (uint *)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
  piVar13 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  while (((long)piVar13 - (long)puVar11 >> 2) +
         ((long)piVar5 - (long)piVar14 >> 2) +
         ((((ulong)((long)ppiVar9 - (long)ppiVar12) >> 3) - 1) +
         (ulong)(ppiVar9 == (_Map_pointer)0x0)) * 0x80 != 0) {
    uStack_70 = 0x1c2f1b;
    (*strategy->_vptr_Strategy[5])(strategy,this,(ulong)*puVar11);
    uStack_70 = 0x1c2f23;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_dropped).c);
    ppiVar9 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppiVar12 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    piVar5 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    piVar14 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first;
    puVar11 = (uint *)(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
    piVar13 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    if (((long)piVar13 - (long)puVar11 >> 2) +
        ((long)piVar5 - (long)piVar14 >> 2) +
        ((((ulong)((long)ppiVar9 - (long)ppiVar12) >> 3) - 1) +
        (ulong)(ppiVar9 == (_Map_pointer)0x0)) * 0x80 == 0) {
      return;
    }
  }
  local_3c = (undefined4)CONCAT71(in_register_00000011,should_poll);
  local_50 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count +
             (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count +
             (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  lVar4 = -((local_50 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0);
  __fds = (pollfd *)((long)&pStack_68 + lVar4);
  p_Var6 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header;
  local_60 = (undefined1 *)&pStack_68;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    uVar15 = 0;
    local_60 = (undefined1 *)&pStack_68;
    do {
      __fds[uVar15].fd = p_Var6[1]._M_color;
      *(undefined4 *)((long)&pStack_68 + uVar15 * 8 + lVar4 + 4) = 3;
      uVar15 = (ulong)((int)uVar15 + 1);
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c2fe9;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  p_Var6 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar2 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var1 = &(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header;
  local_58 = sVar2;
  local_48 = strategy;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    uVar15 = 0;
    do {
      __fds[sVar2 + uVar15].fd = p_Var6[1]._M_color;
      __fds[sVar2 + uVar15].events = 0xc;
      __fds[sVar2 + uVar15].revents = 0;
      uVar15 = (ulong)((int)uVar15 + 1);
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c3033;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  dVar16 = (double)(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var6 = (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header;
  local_38 = dVar16;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    uVar15 = 0;
    do {
      __fds[sVar2 + (long)dVar16 + uVar15].fd = p_Var6[1]._M_color;
      __fds[sVar2 + (long)dVar16 + uVar15].events = 4;
      __fds[sVar2 + (long)dVar16 + uVar15].revents = 0;
      uVar15 = (ulong)((int)uVar15 + 1);
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c307c;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  strategy_00 = local_48;
  if ((local_38 == 0.0 & local_58 == 0 & ~(byte)local_3c &
      (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) == 1) {
    iVar10 = this->m_timeout;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c30b8;
    process_sleep((double)iVar10);
    pp_Var8 = local_48->_vptr_Strategy;
    strategy_00 = local_48;
  }
  else {
    pfds_size = (uint)local_50;
    iVar10 = 0;
    if (((byte)local_3c == 0) && (iVar10 = 0, this->m_timeout != 0)) {
      local_38 = (double)this->m_timeout;
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c30eb;
      cVar7 = clock();
      dVar16 = (double)(cVar7 - this->m_ticks) / 1000000.0;
      if ((local_38 <= dVar16) || ((dVar16 == 0.0 && (!NAN(dVar16))))) {
        *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c3126;
        cVar7 = clock();
        this->m_ticks = cVar7;
        dVar16 = local_38;
      }
      else {
        dVar16 = local_38 - dVar16;
      }
      iVar10 = (int)(dVar16 * 1000.0);
    }
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c3146;
    iVar10 = poll(__fds,(long)(int)pfds_size,iVar10);
    if (iVar10 != 0) {
      if (0 < iVar10) {
        *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c315d;
        processPollList(this,strategy_00,(pollfd *)__fds,pfds_size);
        return;
      }
      p_Var3 = strategy_00->_vptr_Strategy[6];
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c318a;
      (*p_Var3)(strategy_00,this);
      return;
    }
    pp_Var8 = strategy_00->_vptr_Strategy;
  }
  p_Var3 = pp_Var8[7];
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x1c316b;
  (*p_Var3)(strategy_00,this);
  return;
}

Assistant:

void SocketMonitor::block(Strategy &strategy, bool should_poll, double timeout) {
  while (m_dropped.size()) {
    strategy.onError(*this, m_dropped.front());
    m_dropped.pop();
    if (m_dropped.size() == 0) {
      return;
    }
  }

  int pfds_size = m_readSockets.size() + m_connectSockets.size() + m_writeSockets.size();
  struct pollfd pfds[pfds_size];
  buildSet(m_readSockets, pfds, POLLPRI | POLLIN);
  buildSet(m_connectSockets, pfds + m_readSockets.size(), POLLOUT | POLLERR);
  buildSet(m_writeSockets, pfds + m_readSockets.size() + m_connectSockets.size(), POLLOUT);

  if (sleepIfEmpty(should_poll)) {
    strategy.onTimeout(*this);
    return;
  }

  int result = poll(pfds, pfds_size, getTimeval(should_poll, timeout));

  if (result == 0) {
    strategy.onTimeout(*this);
    return;
  } else if (result > 0) {
    processPollList(strategy, pfds, pfds_size);
  } else {
    strategy.onError(*this);
  }
}